

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

p_ply_conflict ply_open_from_file(FILE *fp,p_ply_error_cb error_cb,long idata,void *pdata)

{
  p_ply_conflict ptVar1;
  code *pcVar2;
  
  pcVar2 = ply_error_cb;
  if (error_cb != (p_ply_error_cb)0x0) {
    pcVar2 = error_cb;
  }
  ptVar1 = (p_ply_conflict)calloc(1,0x20f0);
  if (ptVar1 == (p_ply_conflict)0x0) {
    ptVar1 = (p_ply_conflict)0x0;
  }
  else {
    ptVar1->buffer[0] = '\0';
    ptVar1->element = (p_ply_element_conflict)0x0;
    ptVar1->nelements = 0;
    ptVar1->comment = (char *)0x0;
    ptVar1->ncomments = 0;
    ptVar1->obj_info = (char *)0x0;
    ptVar1->nobj_infos = 0;
    ptVar1->buffer_first = 0;
    ptVar1->buffer_token = 0;
    ptVar1->buffer_last = 0;
    ptVar1->idriver = (p_ply_idriver)0x0;
    ptVar1->odriver = (p_ply_odriver)0x0;
    ptVar1->welement = 0;
    ptVar1->wproperty = 0;
    ptVar1->winstance_index = 0;
    ptVar1->wvalue_index = 0;
    ptVar1->wlength = 0;
  }
  if (ptVar1 == (p_ply_conflict)0x0) {
    ptVar1 = (p_ply_conflict)0x0;
    (*pcVar2)((p_ply)0x0,"Out of memory");
  }
  else {
    ptVar1->idata = idata;
    ptVar1->pdata = pdata;
    ptVar1->io_mode = PLY_READ;
    ptVar1->error_cb = pcVar2;
    ptVar1->fp = fp;
    ptVar1->own_fp = 0;
  }
  return ptVar1;
}

Assistant:

p_ply ply_open_from_file(FILE *fp, p_ply_error_cb error_cb,
        long idata, void *pdata) {
    p_ply ply;
    if (error_cb == NULL) error_cb = ply_error_cb;
    assert(fp);
    if (!ply_type_check()) {
        error_cb(NULL, "Incompatible type system");
        return NULL;
    }
    ply = ply_alloc();
    if (!ply) {
        error_cb(NULL, "Out of memory");
        return NULL;
    }
    ply->idata = idata;
    ply->pdata = pdata;
    ply->io_mode = PLY_READ;
    ply->error_cb = error_cb;
    ply->fp = fp;
    ply->own_fp = 0;
    return ply;
}